

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::empty(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *this)

{
  value_t vVar1;
  bool bVar2;
  
  vVar1 = this->m_type;
  if (vVar1 == null) {
    return true;
  }
  if (vVar1 == object) {
    bVar2 = (((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0;
  }
  else {
    if (vVar1 != array) {
      return false;
    }
    bVar2 = (((this->m_value).array)->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
            (((this->m_value).array)->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar2;
}

Assistant:

bool empty() const noexcept {
		switch (m_type) {
			case value_t::null: {
				// null values are empty
				return true;
			}

			case value_t::array: {
				// delegate call to array_t::empty()
				return m_value.array->empty();
			}

			case value_t::object: {
				// delegate call to object_t::empty()
				return m_value.object->empty();
			}

			default: {
				// all other types are nonempty
				return false;
			}
		}
	}